

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Dequantize_x86_avx512::forward
          (Dequantize_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int elempack;
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  Mat local_f8;
  Mat local_a8;
  ulong local_60;
  ulong local_58;
  long local_50;
  Mat *local_48;
  Mat *local_40;
  Mat *local_38;
  
  elempack = bottom_blob->elempack;
  iVar16 = bottom_blob->dims;
  local_60 = (ulong)(uint)bottom_blob->w;
  uVar1 = bottom_blob->h;
  uVar2 = bottom_blob->c;
  uVar17 = (ulong)uVar2;
  Mat::create_like(top_blob,bottom_blob,opt->blob_allocator);
  iVar12 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    sVar13 = (size_t)elempack;
    iVar12 = 0;
    iVar15 = (int)local_60;
    if (iVar16 == 3) {
      iVar12 = 0;
      if (0 < (int)uVar2) {
        if ((int)uVar2 < 2) {
          uVar17 = 1;
        }
        lVar14 = 0;
        uVar18 = 0;
        do {
          sVar3 = bottom_blob->cstep;
          sVar4 = bottom_blob->elemsize;
          pvVar5 = bottom_blob->data;
          sVar6 = top_blob->cstep;
          sVar7 = top_blob->elemsize;
          pvVar8 = top_blob->data;
          if ((this->super_Dequantize).scale_data_size < 2) {
            piVar10 = (this->super_Dequantize).scale_data.refcount;
            local_a8.data = (this->super_Dequantize).scale_data.data;
            piVar11 = (this->super_Dequantize).scale_data.refcount;
            local_a8.refcount._0_4_ = SUB84(piVar11,0);
            local_a8.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
            sVar9 = (this->super_Dequantize).scale_data.elemsize;
            local_a8.elemsize._0_4_ = (undefined4)sVar9;
            local_a8.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
            local_a8.elempack = (this->super_Dequantize).scale_data.elempack;
            local_a8.allocator = (this->super_Dequantize).scale_data.allocator;
            local_a8.dims = (this->super_Dequantize).scale_data.dims;
            local_a8.w = (this->super_Dequantize).scale_data.w;
            local_a8.h = (this->super_Dequantize).scale_data.h;
            local_a8.d = (this->super_Dequantize).scale_data.d;
            local_a8.c = (this->super_Dequantize).scale_data.c;
            local_a8.cstep = (this->super_Dequantize).scale_data.cstep;
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
          }
          else {
            sVar9 = (this->super_Dequantize).scale_data.elemsize;
            local_a8.data =
                 (void *)(sVar9 * lVar14 + (long)(this->super_Dequantize).scale_data.data);
            local_a8.elempack = (this->super_Dequantize).scale_data.elempack;
            local_a8.allocator = (this->super_Dequantize).scale_data.allocator;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = (undefined4)sVar9;
            local_a8.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
            local_a8.w = elempack;
            local_a8.dims = 1;
            local_a8.h = 1;
            local_a8.d = 1;
            local_a8.c = 1;
            local_a8.cstep = sVar13;
          }
          if ((this->super_Dequantize).bias_data_size < 2) {
            piVar10 = (this->super_Dequantize).bias_data.refcount;
            local_f8.data = (this->super_Dequantize).bias_data.data;
            piVar11 = (this->super_Dequantize).bias_data.refcount;
            local_f8.refcount._0_4_ = SUB84(piVar11,0);
            local_f8.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
            sVar9 = (this->super_Dequantize).bias_data.elemsize;
            local_f8.elemsize._0_4_ = (undefined4)sVar9;
            local_f8.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
            local_f8.elempack = (this->super_Dequantize).bias_data.elempack;
            local_f8.allocator = (this->super_Dequantize).bias_data.allocator;
            local_f8.dims = (this->super_Dequantize).bias_data.dims;
            local_f8.w = (this->super_Dequantize).bias_data.w;
            local_f8.h = (this->super_Dequantize).bias_data.h;
            local_f8.d = (this->super_Dequantize).bias_data.d;
            local_f8.c = (this->super_Dequantize).bias_data.c;
            local_f8.cstep = (this->super_Dequantize).bias_data.cstep;
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
          }
          else {
            sVar9 = (this->super_Dequantize).bias_data.elemsize;
            local_f8.data = (void *)(sVar9 * lVar14 + (long)(this->super_Dequantize).bias_data.data)
            ;
            local_f8.elempack = (this->super_Dequantize).bias_data.elempack;
            local_f8.allocator = (this->super_Dequantize).bias_data.allocator;
            local_f8.refcount._0_4_ = 0;
            local_f8.refcount._4_4_ = 0;
            local_f8.elemsize._0_4_ = (undefined4)sVar9;
            local_f8.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
            local_f8.w = elempack;
            local_f8.dims = 1;
            local_f8.h = 1;
            local_f8.d = 1;
            local_f8.c = 1;
            local_f8.cstep = sVar13;
          }
          dequantize((int *)(sVar3 * uVar18 * sVar4 + (long)pvVar5),
                     (float *)(sVar6 * uVar18 * sVar7 + (long)pvVar8),&local_a8,&local_f8,
                     uVar1 * iVar15,elempack);
          piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_f8.allocator == (Allocator *)0x0) {
                if (local_f8.data != (void *)0x0) {
                  free(local_f8.data);
                }
              }
              else {
                (*(local_f8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_f8.cstep = 0;
          local_f8.data = (void *)0x0;
          local_f8.refcount._0_4_ = 0;
          local_f8.refcount._4_4_ = 0;
          local_f8.elemsize._0_4_ = 0;
          local_f8.elemsize._4_4_ = 0;
          local_f8.elempack = 0;
          local_f8.dims = 0;
          local_f8.w = 0;
          local_f8.h = 0;
          local_f8.d = 0;
          local_f8.c = 0;
          piVar10 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                if (local_a8.data != (void *)0x0) {
                  free(local_a8.data);
                }
              }
              else {
                (*(local_a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + sVar13;
        } while (uVar17 != uVar18);
        iVar12 = 0;
      }
    }
    else if (iVar16 == 2) {
      if (0 < (int)uVar1) {
        lVar14 = 0;
        uVar17 = 0;
        do {
          iVar16 = bottom_blob->w;
          sVar3 = bottom_blob->elemsize;
          pvVar5 = bottom_blob->data;
          iVar12 = top_blob->w;
          sVar4 = top_blob->elemsize;
          pvVar8 = top_blob->data;
          if ((this->super_Dequantize).scale_data_size < 2) {
            piVar10 = (this->super_Dequantize).scale_data.refcount;
            local_a8.data = (this->super_Dequantize).scale_data.data;
            piVar11 = (this->super_Dequantize).scale_data.refcount;
            local_a8.refcount._0_4_ = SUB84(piVar11,0);
            local_a8.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
            sVar6 = (this->super_Dequantize).scale_data.elemsize;
            local_a8.elemsize._0_4_ = (undefined4)sVar6;
            local_a8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_a8.elempack = (this->super_Dequantize).scale_data.elempack;
            local_a8.allocator = (this->super_Dequantize).scale_data.allocator;
            local_a8.dims = (this->super_Dequantize).scale_data.dims;
            local_a8.w = (this->super_Dequantize).scale_data.w;
            local_a8.h = (this->super_Dequantize).scale_data.h;
            local_a8.d = (this->super_Dequantize).scale_data.d;
            local_a8.c = (this->super_Dequantize).scale_data.c;
            local_a8.cstep = (this->super_Dequantize).scale_data.cstep;
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
          }
          else {
            sVar6 = (this->super_Dequantize).scale_data.elemsize;
            local_a8.data =
                 (void *)(sVar6 * lVar14 + (long)(this->super_Dequantize).scale_data.data);
            local_a8.elempack = (this->super_Dequantize).scale_data.elempack;
            local_a8.allocator = (this->super_Dequantize).scale_data.allocator;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = (undefined4)sVar6;
            local_a8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_a8.w = elempack;
            local_a8.dims = 1;
            local_a8.h = 1;
            local_a8.d = 1;
            local_a8.c = 1;
            local_a8.cstep = sVar13;
          }
          if ((this->super_Dequantize).bias_data_size < 2) {
            piVar10 = (this->super_Dequantize).bias_data.refcount;
            local_f8.data = (this->super_Dequantize).bias_data.data;
            piVar11 = (this->super_Dequantize).bias_data.refcount;
            local_f8.refcount._0_4_ = SUB84(piVar11,0);
            local_f8.refcount._4_4_ = (undefined4)((ulong)piVar11 >> 0x20);
            sVar6 = (this->super_Dequantize).bias_data.elemsize;
            local_f8.elemsize._0_4_ = (undefined4)sVar6;
            local_f8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_f8.elempack = (this->super_Dequantize).bias_data.elempack;
            local_f8.allocator = (this->super_Dequantize).bias_data.allocator;
            local_f8.dims = (this->super_Dequantize).bias_data.dims;
            local_f8.w = (this->super_Dequantize).bias_data.w;
            local_f8.h = (this->super_Dequantize).bias_data.h;
            local_f8.d = (this->super_Dequantize).bias_data.d;
            local_f8.c = (this->super_Dequantize).bias_data.c;
            local_f8.cstep = (this->super_Dequantize).bias_data.cstep;
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
          }
          else {
            sVar6 = (this->super_Dequantize).bias_data.elemsize;
            local_f8.data = (void *)(sVar6 * lVar14 + (long)(this->super_Dequantize).bias_data.data)
            ;
            local_f8.elempack = (this->super_Dequantize).bias_data.elempack;
            local_f8.allocator = (this->super_Dequantize).bias_data.allocator;
            local_f8.refcount._0_4_ = 0;
            local_f8.refcount._4_4_ = 0;
            local_f8.elemsize._0_4_ = (undefined4)sVar6;
            local_f8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
            local_f8.w = elempack;
            local_f8.dims = 1;
            local_f8.h = 1;
            local_f8.d = 1;
            local_f8.c = 1;
            local_f8.cstep = sVar13;
          }
          dequantize((int *)((long)iVar16 * uVar17 * sVar3 + (long)pvVar5),
                     (float *)((long)iVar12 * uVar17 * sVar4 + (long)pvVar8),&local_a8,&local_f8,
                     (int)local_60,elempack);
          piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_f8.allocator == (Allocator *)0x0) {
                if (local_f8.data != (void *)0x0) {
                  free(local_f8.data);
                }
              }
              else {
                (*(local_f8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_f8.cstep = 0;
          local_f8.data = (void *)0x0;
          local_f8.refcount._0_4_ = 0;
          local_f8.refcount._4_4_ = 0;
          local_f8.elemsize._0_4_ = 0;
          local_f8.elemsize._4_4_ = 0;
          local_f8.elempack = 0;
          local_f8.dims = 0;
          local_f8.w = 0;
          local_f8.h = 0;
          local_f8.d = 0;
          local_f8.c = 0;
          piVar10 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                if (local_a8.data != (void *)0x0) {
                  free(local_a8.data);
                }
              }
              else {
                (*(local_a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          uVar17 = uVar17 + 1;
          lVar14 = lVar14 + sVar13;
        } while (uVar1 != uVar17);
      }
      iVar12 = 0;
    }
    else if (iVar16 == 1) {
      uVar17 = (long)((ulong)(uint)(iVar15 >> 0x1f) << 0x20 | local_60 & 0xffffffff) /
               (long)opt->num_threads;
      local_58 = 1;
      if (1 < (int)uVar17) {
        local_58 = uVar17 & 0xffffffff;
      }
      uVar17 = (long)(iVar15 + (int)local_58 + -1) / (long)(int)local_58;
      if (0 < (int)uVar17) {
        local_40 = &(this->super_Dequantize).scale_data;
        local_48 = &(this->super_Dequantize).bias_data;
        uVar17 = uVar17 & 0xffffffff;
        local_50 = local_58 * sVar13 * 4;
        lVar14 = 0;
        uVar18 = local_60 & 0xffffffff;
        local_38 = top_blob;
        do {
          iVar12 = (int)local_58;
          iVar15 = (int)uVar18;
          iVar16 = iVar15;
          if (iVar12 < iVar15) {
            iVar16 = iVar12;
          }
          dequantize((int *)((long)bottom_blob->data + lVar14),
                     (float *)((long)local_38->data + lVar14),local_40,local_48,iVar16 * elempack,1)
          ;
          lVar14 = lVar14 + local_50;
          uVar18 = (ulong)(uint)-(iVar12 - iVar15);
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      iVar12 = 0;
    }
  }
  return iVar12;
}

Assistant:

int Dequantize_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            float* ptr = (float*)top_blob + i * elempack;

            // assert scale_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            dequantize(intptr, ptr, scale_data, bias_data, size, 1);
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_i, bias_data_i, w, elempack);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_q, bias_data_q, w * h, elempack);
        }
    }

    return 0;
}